

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.cpp
# Opt level: O0

int mbedtls_pem_read_buffer
              (mbedtls_pem_context *ctx,char *header,char *footer,uchar *data,uchar *pwd,
              size_t pwdlen,size_t *use_len)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  void *pvVar4;
  size_t *in_RCX;
  char *in_RDX;
  uchar *in_RSI;
  undefined8 *in_RDI;
  uchar *in_R8;
  size_t in_R9;
  uchar *end;
  uchar *s2;
  uchar *s1;
  uchar *buf;
  size_t len;
  int enc;
  int ret;
  char *buf_00;
  char *local_58;
  size_t local_48;
  int local_4;
  
  if (in_RDI == (undefined8 *)0x0) {
    local_4 = -0x1480;
  }
  else {
    local_58 = strstr((char *)in_RCX,(char *)in_RSI);
    if (local_58 == (char *)0x0) {
      local_4 = -0x1080;
    }
    else {
      pcVar2 = strstr((char *)in_RCX,in_RDX);
      if ((pcVar2 == (char *)0x0) || (pcVar2 <= local_58)) {
        local_4 = -0x1080;
      }
      else {
        sVar3 = strlen((char *)in_RSI);
        local_58 = local_58 + sVar3;
        if (*local_58 == ' ') {
          local_58 = local_58 + 1;
        }
        if (*local_58 == '\r') {
          local_58 = local_58 + 1;
        }
        if (*local_58 == '\n') {
          local_58 = local_58 + 1;
          buf_00 = pcVar2;
          sVar3 = strlen(in_RDX);
          pcVar2 = pcVar2 + sVar3;
          if (*pcVar2 == ' ') {
            pcVar2 = pcVar2 + 1;
          }
          if (*pcVar2 == '\r') {
            pcVar2 = pcVar2 + 1;
          }
          if (*pcVar2 == '\n') {
            pcVar2 = pcVar2 + 1;
          }
          *(long *)s2 = (long)pcVar2 - (long)in_RCX;
          if (((long)buf_00 - (long)local_58 < 0x16) ||
             (iVar1 = memcmp(local_58,"Proc-Type: 4,ENCRYPTED",0x16), iVar1 != 0)) {
            if (local_58 < buf_00) {
              iVar1 = mbedtls_base64_decode(in_RSI,(size_t)in_RDX,in_RCX,in_R8,in_R9);
              if (iVar1 == -0x2c) {
                local_4 = mbedtls_error_add(-0x1100,-0x2c,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/third_party/mbedtls/library/pem.cpp"
                                            ,0x19c);
              }
              else if (local_48 == 0) {
                local_4 = -0x1480;
              }
              else {
                pvVar4 = calloc(1,local_48);
                if (pvVar4 == (void *)0x0) {
                  local_4 = -0x1180;
                }
                else {
                  iVar1 = mbedtls_base64_decode(in_RSI,(size_t)in_RDX,in_RCX,in_R8,in_R9);
                  if (iVar1 == 0) {
                    *in_RDI = pvVar4;
                    in_RDI[1] = local_48;
                    local_4 = 0;
                  }
                  else {
                    mbedtls_zeroize_and_free(buf_00,(size_t)pcVar2);
                    local_4 = mbedtls_error_add(-0x1100,iVar1,
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/third_party/mbedtls/library/pem.cpp"
                                                ,0x1a9);
                  }
                }
              }
            }
            else {
              local_4 = -0x1100;
            }
          }
          else {
            local_4 = -0x1400;
          }
        }
        else {
          local_4 = -0x1080;
        }
      }
    }
  }
  return local_4;
}

Assistant:

int mbedtls_pem_read_buffer(mbedtls_pem_context *ctx, const char *header, const char *footer,
                            const unsigned char *data, const unsigned char *pwd,
                            size_t pwdlen, size_t *use_len)
{
    int ret, enc;
    size_t len;
    unsigned char *buf;
    const unsigned char *s1, *s2, *end;
#if defined(PEM_RFC1421)
    unsigned char pem_iv[16];
    mbedtls_cipher_type_t enc_alg = MBEDTLS_CIPHER_NONE;
#else
    ((void) pwd);
    ((void) pwdlen);
#endif /* PEM_RFC1421 */

    if (ctx == NULL) {
        return MBEDTLS_ERR_PEM_BAD_INPUT_DATA;
    }

    s1 = (unsigned char *) strstr((const char *) data, header);

    if (s1 == NULL) {
        return MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT;
    }

    s2 = (unsigned char *) strstr((const char *) data, footer);

    if (s2 == NULL || s2 <= s1) {
        return MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT;
    }

    s1 += strlen(header);
    if (*s1 == ' ') {
        s1++;
    }
    if (*s1 == '\r') {
        s1++;
    }
    if (*s1 == '\n') {
        s1++;
    } else {
        return MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT;
    }

    end = s2;
    end += strlen(footer);
    if (*end == ' ') {
        end++;
    }
    if (*end == '\r') {
        end++;
    }
    if (*end == '\n') {
        end++;
    }
    *use_len = (size_t) (end - data);

    enc = 0;

    if (s2 - s1 >= 22 && memcmp(s1, "Proc-Type: 4,ENCRYPTED", 22) == 0) {
#if defined(PEM_RFC1421)
        enc++;

        s1 += 22;
        if (*s1 == '\r') {
            s1++;
        }
        if (*s1 == '\n') {
            s1++;
        } else {
            return MBEDTLS_ERR_PEM_INVALID_DATA;
        }


#if defined(MBEDTLS_DES_C)
        if (s2 - s1 >= 23 && memcmp(s1, "DEK-Info: DES-EDE3-CBC,", 23) == 0) {
            enc_alg = MBEDTLS_CIPHER_DES_EDE3_CBC;

            s1 += 23;
            if (s2 - s1 < 16 || pem_get_iv(s1, pem_iv, 8) != 0) {
                return MBEDTLS_ERR_PEM_INVALID_ENC_IV;
            }

            s1 += 16;
        } else if (s2 - s1 >= 18 && memcmp(s1, "DEK-Info: DES-CBC,", 18) == 0) {
            enc_alg = MBEDTLS_CIPHER_DES_CBC;

            s1 += 18;
            if (s2 - s1 < 16 || pem_get_iv(s1, pem_iv, 8) != 0) {
                return MBEDTLS_ERR_PEM_INVALID_ENC_IV;
            }

            s1 += 16;
        }
#endif /* MBEDTLS_DES_C */

#if defined(MBEDTLS_AES_C)
        if (s2 - s1 >= 14 && memcmp(s1, "DEK-Info: AES-", 14) == 0) {
            if (s2 - s1 < 22) {
                return MBEDTLS_ERR_PEM_UNKNOWN_ENC_ALG;
            } else if (memcmp(s1, "DEK-Info: AES-128-CBC,", 22) == 0) {
                enc_alg = MBEDTLS_CIPHER_AES_128_CBC;
            } else if (memcmp(s1, "DEK-Info: AES-192-CBC,", 22) == 0) {
                enc_alg = MBEDTLS_CIPHER_AES_192_CBC;
            } else if (memcmp(s1, "DEK-Info: AES-256-CBC,", 22) == 0) {
                enc_alg = MBEDTLS_CIPHER_AES_256_CBC;
            } else {
                return MBEDTLS_ERR_PEM_UNKNOWN_ENC_ALG;
            }

            s1 += 22;
            if (s2 - s1 < 32 || pem_get_iv(s1, pem_iv, 16) != 0) {
                return MBEDTLS_ERR_PEM_INVALID_ENC_IV;
            }

            s1 += 32;
        }
#endif /* MBEDTLS_AES_C */

        if (enc_alg == MBEDTLS_CIPHER_NONE) {
            return MBEDTLS_ERR_PEM_UNKNOWN_ENC_ALG;
        }

        if (*s1 == '\r') {
            s1++;
        }
        if (*s1 == '\n') {
            s1++;
        } else {
            return MBEDTLS_ERR_PEM_INVALID_DATA;
        }
#else
        return MBEDTLS_ERR_PEM_FEATURE_UNAVAILABLE;
#endif /* PEM_RFC1421 */
    }

    if (s1 >= s2) {
        return MBEDTLS_ERR_PEM_INVALID_DATA;
    }

    ret = mbedtls_base64_decode(NULL, 0, &len, s1, (size_t) (s2 - s1));

    if (ret == MBEDTLS_ERR_BASE64_INVALID_CHARACTER) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PEM_INVALID_DATA, ret);
    }

    if (len == 0) {
        return MBEDTLS_ERR_PEM_BAD_INPUT_DATA;
    }

    if ((buf = (unsigned char *)mbedtls_calloc(1, len)) == NULL) {
        return MBEDTLS_ERR_PEM_ALLOC_FAILED;
    }

    if ((ret = mbedtls_base64_decode(buf, len, &len, s1, (size_t) (s2 - s1))) != 0) {
        mbedtls_zeroize_and_free(buf, len);
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PEM_INVALID_DATA, ret);
    }

    if (enc != 0) {
#if defined(PEM_RFC1421)
        if (pwd == NULL) {
            mbedtls_zeroize_and_free(buf, len);
            return MBEDTLS_ERR_PEM_PASSWORD_REQUIRED;
        }

        ret = 0;

#if defined(MBEDTLS_DES_C)
        if (enc_alg == MBEDTLS_CIPHER_DES_EDE3_CBC) {
            ret = pem_des3_decrypt(pem_iv, buf, len, pwd, pwdlen);
        } else if (enc_alg == MBEDTLS_CIPHER_DES_CBC) {
            ret = pem_des_decrypt(pem_iv, buf, len, pwd, pwdlen);
        }
#endif /* MBEDTLS_DES_C */

#if defined(MBEDTLS_AES_C)
        if (enc_alg == MBEDTLS_CIPHER_AES_128_CBC) {
            ret = pem_aes_decrypt(pem_iv, 16, buf, len, pwd, pwdlen);
        } else if (enc_alg == MBEDTLS_CIPHER_AES_192_CBC) {
            ret = pem_aes_decrypt(pem_iv, 24, buf, len, pwd, pwdlen);
        } else if (enc_alg == MBEDTLS_CIPHER_AES_256_CBC) {
            ret = pem_aes_decrypt(pem_iv, 32, buf, len, pwd, pwdlen);
        }
#endif /* MBEDTLS_AES_C */

        if (ret != 0) {
            mbedtls_zeroize_and_free(buf, len);
            return ret;
        }

        /* Check PKCS padding and update data length based on padding info.
         * This can be used to detect invalid padding data and password
         * mismatches. */
        size_t unpadded_len;
        ret = pem_check_pkcs_padding(buf, len, &unpadded_len);
        if (ret != 0) {
            mbedtls_zeroize_and_free(buf, len);
            return ret;
        }
        len = unpadded_len;
#else
        mbedtls_zeroize_and_free(buf, len);
        return MBEDTLS_ERR_PEM_FEATURE_UNAVAILABLE;
#endif /* PEM_RFC1421 */
    }

    ctx->buf = buf;
    ctx->buflen = len;

    return 0;
}